

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O0

int mk_buffer_cat(mk_ptr_t *p,char *buf1,int len1,char *buf2,int len2)

{
  char *pcVar1;
  int len2_local;
  char *buf2_local;
  int len1_local;
  char *buf1_local;
  mk_ptr_t *p_local;
  
  if (len1 < 0 || len2 < 0) {
    p_local._4_4_ = -1;
  }
  else {
    pcVar1 = (char *)mk_mem_alloc((long)(len1 + len2 + 1));
    p->data = pcVar1;
    memcpy(p->data,buf1,(long)len1);
    memcpy(p->data + len1,buf2,(long)len2);
    p->data[len1 + len2] = '\0';
    p->len = (long)(len1 + len2);
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int mk_buffer_cat(mk_ptr_t *p, char *buf1, int len1, char *buf2, int len2)
{
    /* Validate lengths */
    if (mk_unlikely(len1 < 0 || len2 < 0)) {
         return -1;
    }

    /* alloc space */
    p->data = (char *) mk_mem_alloc(len1 + len2 + 1);

    /* copy data */
    memcpy(p->data, buf1, len1);
    memcpy(p->data + len1, buf2, len2);
    p->data[len1 + len2] = '\0';

    /* assign len */
    p->len = len1 + len2;

    return 0;
}